

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

void unpack_scanline(uchar *out,uchar *scanline,uint32_t width,uint bit_depth,int fmt)

{
  uint8_t uVar1;
  byte bVar2;
  uint local_44;
  uint16_t alpha;
  uint16_t sample;
  uint32_t i;
  spng__iter iter;
  int fmt_local;
  uint bit_depth_local;
  uint32_t width_local;
  uchar *scanline_local;
  uchar *out_local;
  
  iter.samples._4_4_ = fmt;
  spng__iter_init((spng__iter *)&alpha,bit_depth,scanline);
  if (iter.samples._4_4_ == 0x10) {
    for (local_44 = 0; local_44 < width; local_44 = local_44 + 1) {
      uVar1 = get_sample((spng__iter *)&alpha);
      out[local_44 << 1] = uVar1;
      out[local_44 * 2 + 1] = 0xff;
    }
  }
  else if (iter.samples._4_4_ == 0x20) {
    if (bit_depth == 0x10) {
      for (local_44 = 0; local_44 < width; local_44 = local_44 + 1) {
        *(undefined2 *)(out + (local_44 << 2)) = *(undefined2 *)(scanline + (local_44 << 1));
        (out + (ulong)(local_44 << 2) + 2)[0] = 0xff;
        (out + (ulong)(local_44 << 2) + 2)[1] = 0xff;
      }
    }
    else {
      for (local_44 = 0; local_44 < width; local_44 = local_44 + 1) {
        bVar2 = get_sample((spng__iter *)&alpha);
        *(ushort *)(out + (local_44 << 2)) = (ushort)bVar2;
        (out + (ulong)(local_44 << 2) + 2)[0] = 0xff;
        (out + (ulong)(local_44 << 2) + 2)[1] = 0xff;
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < width; local_44 = local_44 + 1) {
      uVar1 = get_sample((spng__iter *)&alpha);
      out[local_44] = uVar1;
    }
  }
  return;
}

Assistant:

static void unpack_scanline(unsigned char *out, const unsigned char *scanline, uint32_t width, unsigned bit_depth, int fmt)
{
    struct spng__iter iter = spng__iter_init(bit_depth, scanline);
    uint32_t i;
    uint16_t sample, alpha = 65535;


    if(fmt == SPNG_FMT_GA8) goto ga8;
    else if(fmt == SPNG_FMT_GA16) goto ga16;

    /* 1/2/4-bit -> 8-bit */
    for(i=0; i < width; i++) out[i] = get_sample(&iter);

    return;

ga8:
    /* 1/2/4/8-bit -> GA8 */
    for(i=0; i < width; i++)
    {
        out[i*2] = get_sample(&iter);
        out[i*2 + 1] = 255;
    }

    return;

ga16:

    /* 16 -> GA16 */
    if(bit_depth == 16)
    {
        for(i=0; i < width; i++)
        {
            memcpy(out + i * 4, scanline + i * 2, 2);
            memcpy(out + i * 4 + 2, &alpha, 2);
        }
        return;
    }

     /* 1/2/4/8-bit -> GA16 */
    for(i=0; i < width; i++)
    {
        sample = get_sample(&iter);
        memcpy(out + i * 4, &sample, 2);
        memcpy(out + i * 4 + 2, &alpha, 2);
    }
}